

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O3

bool __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::pointIsInSector
          (SimpleToMonotone *this,int vertex,int sector)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Edge *pEVar5;
  QPodPoint *pQVar6;
  bool bVar7;
  long lVar8;
  QPodPoint *v1;
  long lVar9;
  QPodPoint *v3;
  
  lVar8 = (long)sector;
  pEVar5 = (this->m_edges).buffer;
  uVar1 = pEVar5[lVar8].from;
  pQVar6 = (this->m_parent->m_vertices).buffer;
  iVar2 = pQVar6[uVar1].x;
  iVar3 = pQVar6[uVar1].y;
  while( true ) {
    if ((pQVar6[pEVar5[vertex].from].x != iVar2) || (pQVar6[pEVar5[vertex].from].y != iVar3)) break;
    vertex = pEVar5[vertex].next;
  }
  lVar9 = lVar8;
  do {
    lVar9 = (long)pEVar5[lVar9].next;
    uVar4 = pEVar5[lVar9].from;
    if (pQVar6[uVar4].x != iVar2) break;
  } while (pQVar6[uVar4].y == iVar3);
  v3 = pQVar6 + uVar4;
  do {
    lVar8 = (long)pEVar5[lVar8].previous;
    uVar4 = pEVar5[lVar8].from;
    if (pQVar6[uVar4].x != iVar2) break;
  } while (pQVar6[uVar4].y == iVar3);
  v1 = pQVar6 + uVar4;
  if (this->m_clockwiseOrder == true) {
    v1 = v3;
    v3 = pQVar6 + uVar4;
  }
  bVar7 = pointIsInSector(this,pQVar6 + pEVar5[vertex].from,v1,pQVar6 + uVar1,v3);
  return bVar7;
}

Assistant:

bool QTriangulator<T>::SimpleToMonotone::pointIsInSector(int vertex, int sector)
{
    const QPodPoint &center = m_parent->m_vertices.at(m_edges.at(sector).from);
    // Handle degenerate edges.
    while (m_parent->m_vertices.at(m_edges.at(vertex).from) == center)
        vertex = m_edges.at(vertex).next;
    int next = m_edges.at(sector).next;
    while (m_parent->m_vertices.at(m_edges.at(next).from) == center)
        next = m_edges.at(next).next;
    int previous = m_edges.at(sector).previous;
    while (m_parent->m_vertices.at(m_edges.at(previous).from) == center)
        previous = m_edges.at(previous).previous;

    const QPodPoint &p = m_parent->m_vertices.at(m_edges.at(vertex).from);
    const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(previous).from);
    const QPodPoint &v3 = m_parent->m_vertices.at(m_edges.at(next).from);
    if (m_clockwiseOrder)
        return pointIsInSector(p, v3, center, v1);
    else
        return pointIsInSector(p, v1, center, v3);
}